

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

CK_ATTRIBUTE_TYPE __thiscall ObjectFile::nextAttributeType(ObjectFile *this,CK_ATTRIBUTE_TYPE type)

{
  bool bVar1;
  pointer ppVar2;
  iterator n;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar3;
  _Self local_50;
  _Self local_48 [3];
  _Self local_30 [5];
  unsigned_long local_8;
  
  MutexLocker::MutexLocker
            ((MutexLocker *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
       ::upper_bound((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                      *)in_stack_ffffffffffffff88,(key_type *)0x155359);
  while( true ) {
    local_48[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
         ::end((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                *)in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(local_30,local_48);
    uVar3 = false;
    if (bVar1) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_> *)
                          0x1553a5);
      uVar3 = ppVar2->second == (OSAttribute *)0x0;
    }
    if ((bool)uVar3 == false) break;
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_> *)
               CONCAT17(uVar3,in_stack_ffffffffffffff90));
  }
  local_50._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
       ::end((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              *)in_stack_ffffffffffffff88);
  bVar1 = std::operator==(local_30,&local_50);
  if (bVar1) {
    local_8 = 0;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_> *)
                        0x155426);
    local_8 = ppVar2->first;
  }
  MutexLocker::~MutexLocker((MutexLocker *)CONCAT17(uVar3,in_stack_ffffffffffffff90));
  return local_8;
}

Assistant:

CK_ATTRIBUTE_TYPE ObjectFile::nextAttributeType(CK_ATTRIBUTE_TYPE type)
{
	MutexLocker lock(objectMutex);

	std::map<CK_ATTRIBUTE_TYPE, OSAttribute*>::iterator n = attributes.upper_bound(type);

	// skip null attributes
	while ((n != attributes.end()) && (n->second == NULL))
		++n;

	// return type or CKA_CLASS (= 0)
	if (n == attributes.end())
	{
		return CKA_CLASS;
	}
	else
	{
		return n->first;
	}
}